

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_key_prefix_splits
          (tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,uint64_t splits)

{
  bool bVar1;
  char *message;
  AssertHelper local_40;
  Message local_38;
  uint64_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint64_t splits_local;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )splits;
  local_30 = mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             ::get_key_prefix_splits(&this->test_db);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_28,"(test_db.get_key_prefix_splits())","(splits)",&local_30,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2d5,message);
    testing::internal::AssertHelper::operator=(&local_40,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

constexpr void assert_key_prefix_splits(std::uint64_t splits) const noexcept {
    UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(), splits);
  }